

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O2

void __thiscall Assimp::ASEImporter::BuildUniqueRepresentation(ASEImporter *this,Mesh *mesh)

{
  pointer paVar1;
  pointer paVar2;
  long lVar3;
  long lVar4;
  pointer paVar5;
  pointer pBVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  uint n;
  pointer pFVar15;
  ulong uVar16;
  long lVar17;
  uint (*pauVar18) [3];
  uint (*pauVar19) [3];
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> mNormals;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> mVertexColors;
  vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_> mBoneVertices;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> mPositions;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> amTexCoords [8];
  
  mPositions.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  mPositions.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  mPositions.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  memset(amTexCoords,0,0xc0);
  mVertexColors.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  mVertexColors.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  mVertexColors.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  mNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  mNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mBoneVertices.
  super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  mBoneVertices.
  super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  mBoneVertices.
  super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar16 = ((long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                  super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
                  super__Vector_impl_data._M_finish -
           (long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                 super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
                 super__Vector_impl_data._M_start) / 0x2c & 0xffffffff;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize(&mPositions,uVar16);
  for (lVar17 = 0; lVar17 != 0xc0; lVar17 = lVar17 + 0x18) {
    if (*(long *)((long)&mesh->amTexCoords[0].
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar17) !=
        *(long *)((long)&mesh->amTexCoords[0].
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish + lVar17)) {
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                 ((long)&amTexCoords[0].
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar17),uVar16);
    }
  }
  if ((mesh->mVertexColors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (mesh->mVertexColors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize(&mVertexColors,uVar16)
    ;
  }
  if ((mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize(&mNormals,uVar16);
  }
  if ((mesh->mBoneVertices).
      super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (mesh->mBoneVertices).
      super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::resize
              (&mBoneVertices,uVar16);
  }
  pFVar15 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
            super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
            super__Vector_impl_data._M_start;
  pauVar18 = pFVar15->amUVIndices;
  uVar16 = 0;
  iVar12 = 0;
  for (; pFVar15 !=
         (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
         super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
         super__Vector_impl_data._M_finish; pFVar15 = pFVar15 + 1) {
    pauVar19 = pauVar18;
    for (lVar17 = 0; lVar17 != 3; lVar17 = lVar17 + 1) {
      uVar11 = (pFVar15->super_FaceWithSmoothingGroup).mIndices[lVar17];
      paVar2 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      mPositions.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[uVar16].z = *(float *)((long)(paVar2 + uVar11) + 8);
      paVar2 = paVar2 + uVar11;
      fVar7 = paVar2->y;
      mPositions.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[uVar16].x = paVar2->x;
      mPositions.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[uVar16].y = fVar7;
      for (lVar10 = 0;
          (lVar10 != 0x60 &&
          (lVar3 = *(long *)((long)&mesh->amTexCoords[0].
                                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar10 * 2),
          lVar3 != *(long *)((long)&mesh->amTexCoords[0].
                                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + lVar10 * 2)));
          lVar10 = lVar10 + 0xc) {
        lVar14 = (ulong)*(uint *)((long)*pauVar19 + lVar10) * 0xc;
        lVar4 = *(long *)((long)&amTexCoords[0].
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar10 * 2);
        *(undefined4 *)(lVar4 + 8 + uVar16 * 0xc) = *(undefined4 *)(lVar3 + 8 + lVar14);
        *(undefined8 *)(lVar4 + uVar16 * 0xc) = *(undefined8 *)(lVar3 + lVar14);
      }
      paVar5 = (mesh->mVertexColors).
               super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (paVar5 != (mesh->mVertexColors).
                    super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
                    .super__Vector_impl_data._M_finish) {
        paVar5 = paVar5 + pFVar15->mColorIndices[lVar17];
        fVar7 = paVar5->g;
        fVar8 = paVar5->b;
        fVar9 = paVar5->a;
        paVar1 = mVertexColors.
                 super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar16;
        paVar1->r = paVar5->r;
        paVar1->g = fVar7;
        paVar1->b = fVar8;
        paVar1->a = fVar9;
      }
      paVar2 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (paVar2 != (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
        uVar11 = iVar12 * 3 + (int)lVar17;
        mNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start[uVar16].z = paVar2[uVar11].z;
        fVar7 = paVar2[uVar11].y;
        mNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start[uVar16].x = paVar2[uVar11].x;
        mNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start[uVar16].y = fVar7;
        aiVector3t<float>::Normalize
                  (mNormals.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar16);
      }
      uVar13 = (ulong)(pFVar15->super_FaceWithSmoothingGroup).mIndices[lVar17];
      pBVar6 = (mesh->mBoneVertices).
               super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (uVar13 < (ulong)(((long)(mesh->mBoneVertices).
                                  super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar6) / 0x18)
         ) {
        std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::operator=
                  (&mBoneVertices.
                    super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar16].mBoneWeights,
                   &pBVar6[uVar13].mBoneWeights);
      }
      (pFVar15->super_FaceWithSmoothingGroup).mIndices[lVar17] = (uint32_t)uVar16;
      uVar16 = (ulong)((uint32_t)uVar16 + 1);
      pauVar19 = (uint (*) [3])(*pauVar19 + 1);
    }
    iVar12 = iVar12 + 1;
    pauVar18 = pauVar18 + 0xb;
  }
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator=
            (&(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals,&mNormals);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator=
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)mesh,&mPositions);
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::operator=
            (&mesh->mVertexColors,&mVertexColors);
  for (lVar17 = 0; lVar17 != 0xc0; lVar17 = lVar17 + 0x18) {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator=
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
               ((long)&mesh->amTexCoords[0].
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar17),
               (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
               ((long)&amTexCoords[0].
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar17));
  }
  std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::~vector
            (&mBoneVertices);
  std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
            (&mNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
  std::_Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::~_Vector_base
            (&mVertexColors.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
            );
  lVar17 = 0xa8;
  do {
    std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
              ((_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
               ((long)&amTexCoords[0].
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar17));
    lVar17 = lVar17 + -0x18;
  } while (lVar17 != -0x18);
  std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
            (&mPositions.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
  ;
  return;
}

Assistant:

void ASEImporter::BuildUniqueRepresentation(ASE::Mesh& mesh)    {
    // allocate output storage
    std::vector<aiVector3D> mPositions;
    std::vector<aiVector3D> amTexCoords[AI_MAX_NUMBER_OF_TEXTURECOORDS];
    std::vector<aiColor4D>  mVertexColors;
    std::vector<aiVector3D> mNormals;
    std::vector<BoneVertex> mBoneVertices;

    unsigned int iSize = (unsigned int)mesh.mFaces.size() * 3;
    mPositions.resize(iSize);

    // optional texture coordinates
    for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS;++i)    {
        if (!mesh.amTexCoords[i].empty())   {
            amTexCoords[i].resize(iSize);
        }
    }
    // optional vertex colors
    if (!mesh.mVertexColors.empty())    {
        mVertexColors.resize(iSize);
    }

    // optional vertex normals (vertex normals can simply be copied)
    if (!mesh.mNormals.empty()) {
        mNormals.resize(iSize);
    }
    // bone vertices. There is no need to change the bone list
    if (!mesh.mBoneVertices.empty())    {
        mBoneVertices.resize(iSize);
    }

    // iterate through all faces in the mesh
    unsigned int iCurrent = 0, fi = 0;
    for (std::vector<ASE::Face>::iterator i =  mesh.mFaces.begin();i != mesh.mFaces.end();++i,++fi) {
        for (unsigned int n = 0; n < 3;++n,++iCurrent)
        {
            mPositions[iCurrent] = mesh.mPositions[(*i).mIndices[n]];

            // add texture coordinates
            for (unsigned int c = 0; c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c)    {
                if (mesh.amTexCoords[c].empty())break;
                amTexCoords[c][iCurrent] = mesh.amTexCoords[c][(*i).amUVIndices[c][n]];
            }
            // add vertex colors
            if (!mesh.mVertexColors.empty())    {
                mVertexColors[iCurrent] = mesh.mVertexColors[(*i).mColorIndices[n]];
            }
            // add normal vectors
            if (!mesh.mNormals.empty()) {
                mNormals[iCurrent] = mesh.mNormals[fi*3+n];
                mNormals[iCurrent].Normalize();
            }

            // handle bone vertices
            if ((*i).mIndices[n] < mesh.mBoneVertices.size())   {
                // (sometimes this will cause bone verts to be duplicated
                //  however, I' quite sure Schrompf' JoinVerticesStep
                //  will fix that again ...)
                mBoneVertices[iCurrent] =  mesh.mBoneVertices[(*i).mIndices[n]];
            }
            (*i).mIndices[n] = iCurrent;
        }
    }

    // replace the old arrays
    mesh.mNormals = mNormals;
    mesh.mPositions = mPositions;
    mesh.mVertexColors = mVertexColors;

    for (unsigned int c = 0; c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c)
        mesh.amTexCoords[c] = amTexCoords[c];
}